

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::addUniqueAttribute
          (GLShaderProgram *this,ShaderSpecAttribute *newAttribute)

{
  bool bVar1;
  __type _Var2;
  value_type *__x;
  string *in_RSI;
  long in_RDI;
  GLShaderAttribute *a;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  *__range2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
  *in_stack_ffffffffffffff70;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_68 [32];
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  reference local_30;
  GLShaderAttribute *local_28;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
  local_20;
  long local_18;
  
  local_18 = in_RDI + 0x48;
  local_20._M_current =
       (GLShaderAttribute *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
       ::begin(in_stack_ffffffffffffff68);
  local_28 = (GLShaderAttribute *)
             std::
             vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
             ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      __x = (value_type *)(in_RDI + 0x48);
      this_00 = local_68;
      std::__cxx11::string::string(this_00,in_RSI);
      local_48 = *(undefined4 *)(in_RSI + 0x20);
      local_44 = *(undefined4 *)(in_RSI + 0x24);
      local_40 = 0xffffffffffffffff;
      local_38 = 0x309;
      local_34 = 0x309;
      std::
      vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
      ::push_back((vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>
                   *)this_00,__x);
      GLShaderAttribute::~GLShaderAttribute((GLShaderAttribute *)0x3de9fb);
      return;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
               ::operator*(&local_20);
    _Var2 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if ((_Var2) && (local_30->type == *(DataType *)(in_RSI + 0x20))) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderAttribute>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void GLShaderProgram::addUniqueAttribute(ShaderSpecAttribute newAttribute) {
  for (GLShaderAttribute& a : attributes) {
    if (a.name == newAttribute.name && a.type == newAttribute.type) {
      return;
    }
  }
  attributes.push_back(GLShaderAttribute{newAttribute.name, newAttribute.type, newAttribute.arrayCount, -1, 777, 777});
}